

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O1

void CSOAA::do_actual_learning_wap(ldf *data,single_learner *base,multi_ex *ec_seq)

{
  pointer ppeVar1;
  pointer ppeVar2;
  example *ec;
  wclass *pwVar3;
  example *ec_00;
  wclass *pwVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  example **example;
  pointer ppeVar8;
  iterator __end1;
  float fVar9;
  vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> all_costs;
  multi_ex *__range1;
  vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> local_b8;
  multi_ex *local_a0;
  label_t local_98;
  wclass *pwStack_90;
  size_t local_88;
  ulong local_78;
  ulong local_70;
  single_learner *local_68;
  vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> local_60;
  undefined1 local_48 [16];
  
  ppeVar1 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_b8.super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (wclass **)0x0;
  local_b8.super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (wclass **)0x0;
  local_a0 = ec_seq;
  local_68 = base;
  if ((long)ppeVar2 - (long)ppeVar1 != 0) {
    ppeVar8 = ppeVar1;
    do {
      local_98 = ((*ppeVar8)->l).multi;
      if (local_b8.
          super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_b8.
          super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<COST_SENSITIVE::wclass*,std::allocator<COST_SENSITIVE::wclass*>>::
        _M_realloc_insert<COST_SENSITIVE::wclass*>
                  ((vector<COST_SENSITIVE::wclass*,std::allocator<COST_SENSITIVE::wclass*>> *)
                   &local_b8,
                   (iterator)
                   local_b8.
                   super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(wclass **)&local_98);
      }
      else {
        *local_b8.
         super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = (wclass *)local_98;
        local_b8.
        super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_b8.
             super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      ppeVar8 = ppeVar8 + 1;
    } while (ppeVar8 != ppeVar2);
  }
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::vector
            (&local_60,&local_b8);
  compute_wap_values(&local_60);
  if (local_60.
      super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (ppeVar2 != ppeVar1) {
    uVar6 = (long)ppeVar2 - (long)ppeVar1 >> 3;
    local_78 = uVar6 + (uVar6 == 0);
    uVar7 = 0;
    do {
      ec = (local_a0->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar7];
      pwVar3 = (ec->l).cs.costs._begin;
      local_88 = (ec->l).cs.costs.erase_count;
      local_98 = (label_t)(ec->l).cs.costs._end;
      pwStack_90 = (ec->l).cs.costs.end_array;
      if ((ulong)pwVar3->class_index != 0xffffffff) {
        LabelDict::add_example_namespace_from_memory
                  (&data->label_features,ec,(ulong)pwVar3->class_index);
        local_70 = uVar7;
        while (uVar7 = uVar7 + 1, uVar7 < uVar6) {
          ec_00 = (local_a0->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar7];
          pwVar4 = (ec_00->l).cs.costs._begin;
          if (((ulong)pwVar4->class_index != 0xffffffff) &&
             (fVar9 = ABS(pwVar4->wap_value - pwVar3->wap_value), local_48 = ZEXT416((uint)fVar9),
             1e-06 <= fVar9)) {
            LabelDict::add_example_namespace_from_memory
                      (&data->label_features,ec_00,(ulong)pwVar4->class_index);
            (ec->l).simple.initial = 0.0;
            (ec->l).simple.label =
                 *(float *)(&DAT_002ad940 +
                           (ulong)(pwVar3->x <= pwVar4->x && pwVar4->x != pwVar3->x) * 4);
            fVar9 = ec->weight;
            ec->weight = (float)local_48._0_4_;
            ec->partial_prediction = 0.0;
            subtract_example(data->all,ec,ec_00);
            uVar5 = (ec->super_example_predict).ft_offset;
            (ec->super_example_predict).ft_offset = data->ft_offset;
            (**(code **)(local_68 + 0x28))
                      (*(undefined8 *)(local_68 + 0x18),*(undefined8 *)(local_68 + 0x20),ec);
            (ec->super_example_predict).ft_offset = uVar5;
            ec->weight = fVar9;
            unsubtract_example(ec);
            LabelDict::del_example_namespace_from_memory
                      (&data->label_features,ec_00,(ulong)pwVar4->class_index);
          }
        }
        LabelDict::del_example_namespace_from_memory
                  (&data->label_features,ec,(ulong)pwVar3->class_index);
        (ec->l).cs.costs._begin = pwVar3;
        (ec->l).cs.costs.erase_count = local_88;
        (ec->l).cs.costs._end = (wclass *)local_98;
        (ec->l).cs.costs.end_array = pwStack_90;
        uVar7 = local_70;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_78);
  }
  if (local_b8.
      super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void do_actual_learning_wap(ldf& data, single_learner& base, multi_ex& ec_seq)
{
  size_t K = ec_seq.size();
  vector<COST_SENSITIVE::wclass*> all_costs;
  for (const auto & example : ec_seq) all_costs.push_back(&example->l.cs.costs[0]);
  compute_wap_values(all_costs);

  for (size_t k1 = 0; k1 < K; k1++)
  {
    example* ec1 = ec_seq[k1];

    // save original variables
    COST_SENSITIVE::label save_cs_label = ec1->l.cs;
    label_data& simple_label = ec1->l.simple;

    v_array<COST_SENSITIVE::wclass> costs1 = save_cs_label.costs;
    if (costs1[0].class_index == (uint32_t)-1)
      continue;

    LabelDict::add_example_namespace_from_memory(data.label_features, *ec1, costs1[0].class_index);

    for (size_t k2 = k1 + 1; k2 < K; k2++)
    {
      example* ec2 = ec_seq[k2];
      v_array<COST_SENSITIVE::wclass> costs2 = ec2->l.cs.costs;

      if (costs2[0].class_index == (uint32_t)-1)
        continue;
      float value_diff = fabs(costs2[0].wap_value - costs1[0].wap_value);
      // float value_diff = fabs(costs2[0].x - costs1[0].x);
      if (value_diff < 1e-6)
        continue;

      LabelDict::add_example_namespace_from_memory(data.label_features, *ec2, costs2[0].class_index);

      // learn
      simple_label.initial = 0.;
      simple_label.label = (costs1[0].x < costs2[0].x) ? -1.0f : 1.0f;
      float old_weight = ec1->weight;
      ec1->weight = value_diff;
      ec1->partial_prediction = 0.;
      subtract_example(*data.all, ec1, ec2);
      uint64_t old_offset = ec1->ft_offset;
      ec1->ft_offset = data.ft_offset;
      base.learn(*ec1);
      ec1->ft_offset = old_offset;
      ec1->weight = old_weight;
      unsubtract_example(ec1);

      LabelDict::del_example_namespace_from_memory(data.label_features, *ec2, costs2[0].class_index);
    }
    LabelDict::del_example_namespace_from_memory(data.label_features, *ec1, costs1[0].class_index);

    // restore original cost-sensitive label, sum of importance weights
    ec1->l.cs = save_cs_label;
    // TODO: What about partial_prediction? See do_actual_learning_oaa.
  }
}